

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_overwrite_decimal128(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  bson_decimal128_t new_value;
  bson_decimal128_t iter_value;
  bson_iter_t iter;
  bson_decimal128_t value;
  bson_t b;
  undefined8 local_220;
  undefined8 uStack_218;
  char local_210;
  char cStack_20f;
  char cStack_20e;
  char cStack_20d;
  char cStack_20c;
  char cStack_20b;
  char cStack_20a;
  char cStack_209;
  char cStack_208;
  char cStack_207;
  char cStack_206;
  char cStack_205;
  char cStack_204;
  char cStack_203;
  char cStack_202;
  char cStack_201;
  undefined1 local_200 [112];
  undefined8 local_190;
  undefined8 local_188;
  undefined1 local_180 [360];
  
  local_188 = 0;
  local_190 = 1;
  uStack_218 = 0;
  local_220 = 2;
  bson_init(local_180);
  cVar1 = bson_append_decimal128(local_180,"key",0xffffffffffffffff,&local_190);
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_decimal128 (&b, \"key\", -1, &value)";
    uVar3 = 0x1ba;
  }
  else {
    cVar1 = bson_iter_init_find(local_200,local_180,"key");
    if (cVar1 == '\0') {
      pcVar4 = "bson_iter_init_find (&iter, &b, \"key\")";
      uVar3 = 0x1bb;
    }
    else {
      iVar2 = bson_iter_type(local_200);
      if (iVar2 == 0x13) {
        bson_iter_overwrite_decimal128(local_200,&local_220);
        cVar1 = bson_iter_init_find(local_200,local_180,"key");
        if (cVar1 == '\0') {
          pcVar4 = "bson_iter_init_find (&iter, &b, \"key\")";
          uVar3 = 0x1be;
        }
        else {
          iVar2 = bson_iter_type(local_200);
          if (iVar2 == 0x13) {
            cVar1 = bson_iter_decimal128(local_200,&local_210);
            if (cVar1 == '\0') {
              pcVar4 = "bson_iter_decimal128 (&iter, &iter_value)";
              uVar3 = 0x1c0;
            }
            else {
              auVar5[0] = -(local_210 == (char)local_220);
              auVar5[1] = -(cStack_20f == (char)((ulong)local_220 >> 8));
              auVar5[2] = -(cStack_20e == (char)((ulong)local_220 >> 0x10));
              auVar5[3] = -(cStack_20d == (char)((ulong)local_220 >> 0x18));
              auVar5[4] = -(cStack_20c == (char)((ulong)local_220 >> 0x20));
              auVar5[5] = -(cStack_20b == (char)((ulong)local_220 >> 0x28));
              auVar5[6] = -(cStack_20a == (char)((ulong)local_220 >> 0x30));
              auVar5[7] = -(cStack_209 == (char)((ulong)local_220 >> 0x38));
              auVar5[8] = -(cStack_208 == (char)uStack_218);
              auVar5[9] = -(cStack_207 == (char)((ulong)uStack_218 >> 8));
              auVar5[10] = -(cStack_206 == (char)((ulong)uStack_218 >> 0x10));
              auVar5[0xb] = -(cStack_205 == (char)((ulong)uStack_218 >> 0x18));
              auVar5[0xc] = -(cStack_204 == (char)((ulong)uStack_218 >> 0x20));
              auVar5[0xd] = -(cStack_203 == (char)((ulong)uStack_218 >> 0x28));
              auVar5[0xe] = -(cStack_202 == (char)((ulong)uStack_218 >> 0x30));
              auVar5[0xf] = -(cStack_201 == (char)((ulong)uStack_218 >> 0x38));
              if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
                bson_destroy(local_180);
                return;
              }
              pcVar4 = "memcmp (&iter_value, &new_value, sizeof (new_value)) == 0";
              uVar3 = 0x1c1;
            }
          }
          else {
            pcVar4 = "BSON_ITER_HOLDS_DECIMAL128 (&iter)";
            uVar3 = 0x1bf;
          }
        }
      }
      else {
        pcVar4 = "BSON_ITER_HOLDS_DECIMAL128 (&iter)";
        uVar3 = 0x1bc;
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uVar3,"test_bson_iter_overwrite_decimal128",pcVar4);
  abort();
}

Assistant:

static void
test_bson_iter_overwrite_decimal128 (void)
{
   bson_iter_t iter;
   bson_t b;
   bson_decimal128_t value;
   bson_decimal128_t new_value;
   bson_decimal128_t iter_value;

   value.high = 0;
   value.low = 1;

   new_value.high = 0;
   new_value.low = 2;

   bson_init (&b);
   BSON_ASSERT (bson_append_decimal128 (&b, "key", -1, &value));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_DECIMAL128 (&iter));
   bson_iter_overwrite_decimal128 (&iter, &new_value);
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_DECIMAL128 (&iter));
   BSON_ASSERT (bson_iter_decimal128 (&iter, &iter_value));
   BSON_ASSERT (memcmp (&iter_value, &new_value, sizeof (new_value)) == 0);
   bson_destroy (&b);
}